

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall
kratos::Simulator::trigger_event
          (Simulator *this,Var *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *bits_mask)

{
  __node_base_ptr this_00;
  bool bVar1;
  mapped_type *pmVar2;
  Var **__args;
  pair<const_kratos::Var_*,_kratos::Stmt_*> pVar3;
  pair<const_kratos::Var_*,_kratos::Stmt_*> local_1a8;
  _Node_iterator_base<kratos::Stmt_*,_false> local_198;
  _Node_iterator_base<kratos::Stmt_*,_false> local_190;
  reference local_188;
  value_type *stmt_1;
  const_iterator __end4;
  const_iterator __begin4;
  mapped_type *__range4;
  mapped_type *deps_1;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_false>
  local_158;
  reference local_150;
  Var **v_1;
  iterator __end2_2;
  iterator __begin2_2;
  unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
  *__range2_2;
  _Node_iterator_base<unsigned_int,_false> local_120 [3];
  _Node_iterator_base<unsigned_int,_false> local_108;
  unordered_set<kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<kratos::Var*>>
  *local_100;
  type *v;
  type *bit;
  _Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false> local_e8;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  mapped_type *__range2_1;
  unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
  vs;
  mapped_type *vars;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false>
  local_88;
  key_type local_80;
  Var *root;
  _Node_iterator_base<kratos::Stmt_*,_false> local_68;
  _Node_iterator_base<kratos::Stmt_*,_false> local_60;
  reference local_58;
  value_type *stmt;
  const_iterator __end2;
  const_iterator __begin2;
  mapped_type *__range2;
  mapped_type *deps;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_false>
  local_28;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_20;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *bits_mask_local;
  Var *var_local;
  Simulator *this_local;
  
  local_20 = bits_mask;
  bits_mask_local =
       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        *)var;
  var_local = (Var *)this;
  bVar1 = std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::empty(bits_mask);
  if (!bVar1) {
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<const_kratos::Var_*,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>_>
         ::find(&this->dependency_,(key_type *)&bits_mask_local);
    deps = (mapped_type *)
           std::
           unordered_map<const_kratos::Var_*,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>_>
           ::end(&this->dependency_);
    bVar1 = std::__detail::operator!=
                      (&local_28,
                       (_Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_false>
                        *)&deps);
    if (bVar1) {
      pmVar2 = std::
               unordered_map<const_kratos::Var_*,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>_>
               ::at(&this->dependency_,(key_type *)&bits_mask_local);
      __end2 = std::
               unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>
               ::begin(pmVar2);
      stmt = (value_type *)
             std::
             unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>
             ::end(pmVar2);
      while (bVar1 = std::__detail::operator!=
                               (&__end2.super__Node_iterator_base<kratos::Stmt_*,_false>,
                                (_Node_iterator_base<kratos::Stmt_*,_false> *)&stmt), bVar1) {
        local_58 = std::__detail::_Node_const_iterator<kratos::Stmt_*,_true,_false>::operator*
                             (&__end2);
        local_60._M_cur =
             (__node_type *)
             std::
             unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>
             ::find(&this->scope_,local_58);
        local_68._M_cur =
             (__node_type *)
             std::
             unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>
             ::end(&this->scope_);
        bVar1 = std::__detail::operator==(&local_60,&local_68);
        if (bVar1) {
          _root = std::make_pair<kratos::Var_const*&,kratos::Stmt*const&>
                            ((Var **)&bits_mask_local,local_58);
          std::
          queue<std::pair<kratos::Var_const*,kratos::Stmt*>,std::deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>>
          ::emplace<std::pair<kratos::Var_const*,kratos::Stmt*>>
                    ((queue<std::pair<kratos::Var_const*,kratos::Stmt*>,std::deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>>
                      *)&this->event_queue_,(pair<const_kratos::Var_*,_kratos::Stmt_*> *)&root);
        }
        std::__detail::_Node_const_iterator<kratos::Stmt_*,_true,_false>::operator++(&__end2);
      }
    }
    local_80 = (key_type)(*(code *)(bits_mask_local->_M_h)._M_buckets[0x28])();
    local_88._M_cur =
         (__node_type *)
         std::
         unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
         ::find(&this->linked_dependency_,&local_80);
    vars = (mapped_type *)
           std::
           unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
           ::end(&this->linked_dependency_);
    bVar1 = std::__detail::operator!=
                      (&local_88,
                       (_Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false>
                        *)&vars);
    if (bVar1) {
      vs._M_h._M_single_bucket =
           (__node_base_ptr)
           std::
           unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
           ::at(&this->linked_dependency_,&local_80);
      std::
      unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
      ::unordered_set((unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
                       *)&__range2_1);
      this_00 = vs._M_h._M_single_bucket;
      __end2_1 = std::
                 unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
                 ::begin((unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
                          *)vs._M_h._M_single_bucket);
      local_e8._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
           ::end((unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
                  *)this_00);
      while (bVar1 = std::__detail::operator!=
                               (&__end2_1.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
                                ,&local_e8), bVar1) {
        bit = &std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>::
               operator*(&__end2_1)->first;
        v = (type *)std::get<0ul,unsigned_int_const,kratos::Var*>
                              ((pair<const_unsigned_int,_kratos::Var_*> *)bit);
        local_100 = (unordered_set<kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<kratos::Var*>>
                     *)std::get<1ul,unsigned_int_const,kratos::Var*>
                                 ((pair<const_unsigned_int,_kratos::Var_*> *)bit);
        local_108._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::find(local_20,(key_type *)v);
        local_120[0]._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::end(local_20);
        bVar1 = std::__detail::operator!=(&local_108,local_120);
        if (bVar1) {
          std::
          unordered_set<kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<kratos::Var*>>
          ::emplace<kratos::Var*const&>
                    ((pair<std::__detail::_Node_iterator<kratos::Var_*,_true,_false>,_bool> *)
                     &__range2_1,local_100,__args);
        }
        std::__detail::
        _Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>::operator++
                  (&__end2_1);
      }
      __end2_2 = std::
                 unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
                 ::begin((unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
                          *)&__range2_1);
      v_1 = (Var **)std::
                    unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
                    ::end((unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
                           *)&__range2_1);
      while( true ) {
        bVar1 = std::__detail::operator!=
                          (&__end2_2.super__Node_iterator_base<kratos::Var_*,_false>,
                           (_Node_iterator_base<kratos::Var_*,_false> *)&v_1);
        if (!bVar1) break;
        local_150 = std::__detail::_Node_iterator<kratos::Var_*,_true,_false>::operator*(&__end2_2);
        local_158._M_cur =
             (__node_type *)
             std::
             unordered_map<const_kratos::Var_*,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>_>
             ::find(&this->dependency_,local_150);
        deps_1 = (mapped_type *)
                 std::
                 unordered_map<const_kratos::Var_*,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>_>
                 ::end(&this->dependency_);
        bVar1 = std::__detail::operator!=
                          (&local_158,
                           (_Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_false>
                            *)&deps_1);
        if (bVar1) {
          pmVar2 = std::
                   unordered_map<const_kratos::Var_*,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>_>
                   ::at(&this->dependency_,local_150);
          __end4 = std::
                   unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>
                   ::begin(pmVar2);
          stmt_1 = (value_type *)
                   std::
                   unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>
                   ::end(pmVar2);
          while( true ) {
            bVar1 = std::__detail::operator!=
                              (&__end4.super__Node_iterator_base<kratos::Stmt_*,_false>,
                               (_Node_iterator_base<kratos::Stmt_*,_false> *)&stmt_1);
            if (!bVar1) break;
            local_188 = std::__detail::_Node_const_iterator<kratos::Stmt_*,_true,_false>::operator*
                                  (&__end4);
            local_190._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>
                 ::find(&this->scope_,local_188);
            local_198._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>
                 ::end(&this->scope_);
            bVar1 = std::__detail::operator==(&local_190,&local_198);
            if (bVar1) {
              pVar3 = std::make_pair<kratos::Var_const*&,kratos::Stmt*const&>
                                ((Var **)&bits_mask_local,local_188);
              local_1a8 = pVar3;
              std::
              queue<std::pair<kratos::Var_const*,kratos::Stmt*>,std::deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>>
              ::emplace<std::pair<kratos::Var_const*,kratos::Stmt*>>
                        ((queue<std::pair<kratos::Var_const*,kratos::Stmt*>,std::deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>>
                          *)&this->event_queue_,&local_1a8);
            }
            std::__detail::_Node_const_iterator<kratos::Stmt_*,_true,_false>::operator++(&__end4);
          }
        }
        std::__detail::_Node_iterator<kratos::Var_*,_true,_false>::operator++(&__end2_2);
      }
      std::
      unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
      ::~unordered_set((unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
                        *)&__range2_1);
    }
    this->simulation_depth_ = this->simulation_depth_ + 1;
  }
  return;
}

Assistant:

void Simulator::trigger_event(const kratos::Var *var,
                              const std::unordered_set<uint32_t> &bits_mask) {
    if (bits_mask.empty()) return;

    if (dependency_.find(var) != dependency_.end()) {
        auto const &deps = dependency_.at(var);
        for (auto const &stmt : deps) {
            if (scope_.find(stmt) == scope_.end()) event_queue_.emplace(std::make_pair(var, stmt));
        }
    }

    const auto *root = var->get_var_root_parent();
    if (linked_dependency_.find(root) != linked_dependency_.end()) {
        auto const &vars = linked_dependency_.at(root);
        std::unordered_set<Var *> vs;
        for (const auto &[bit, v] : vars) {
            if (bits_mask.find(bit) != bits_mask.end()) vs.emplace(v);
        }

        for (auto const &v : vs) {
            if (dependency_.find(v) != dependency_.end()) {
                auto const &deps = dependency_.at(v);
                for (auto const &stmt : deps) {
                    if (scope_.find(stmt) == scope_.end())
                        event_queue_.emplace(std::make_pair(var, stmt));
                }
            }
        }
    }

    // trigger linked events as well
    simulation_depth_++;
}